

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O0

bool linenoise::linenoiseRaw(char *prompt,string *line)

{
  bool bVar1;
  int iVar2;
  char local_1028 [4];
  int count;
  char buf [4096];
  bool quit;
  string *line_local;
  char *prompt_local;
  
  buf[0xfff] = '\0';
  iVar2 = isatty(0);
  if (iVar2 == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)line);
  }
  else {
    bVar1 = enableRawMode(0);
    if (bVar1) {
      iVar2 = linenoiseEdit(0,1,local_1028,0x1000,prompt);
      if (iVar2 == -1) {
        buf[0xfff] = '\x01';
      }
      else {
        std::__cxx11::string::assign((char *)line,(ulong)local_1028);
      }
      disableRawMode(0);
      printf("\n");
    }
  }
  prompt_local._7_1_ = (bool)(buf[0xfff] & 1);
  return prompt_local._7_1_;
}

Assistant:

inline bool linenoiseRaw(const char *prompt, std::string& line) {
    bool quit = false;

    if (!isatty(STDIN_FILENO)) {
        /* Not a tty: read from file / pipe. */
        std::getline(std::cin, line);
    } else {
        /* Interactive editing. */
        if (enableRawMode(STDIN_FILENO) == false) {
            return quit;
        }

        char buf[LINENOISE_MAX_LINE];
        auto count = linenoiseEdit(STDIN_FILENO, STDOUT_FILENO, buf, LINENOISE_MAX_LINE, prompt);
        if (count == -1) {
            quit = true;
        } else {
            line.assign(buf, count);
        }

        disableRawMode(STDIN_FILENO);
        printf("\n");
    }
    return quit;
}